

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<const_char_*,_void_(const_char_*const_&)>::~PromiseDataBase
          (PromiseDataBase<const_char_*,_void_(const_char_*const_&)> *this)

{
  code *pcVar1;
  PromiseDataBase<const_char_*,_void_(const_char_*const_&)> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }